

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool absl::debugging_internal::MaybeAppendDecimal(State *state,int val)

{
  undefined1 in_AL;
  undefined1 extraout_AL;
  uint uVar1;
  char *pcVar2;
  size_t length;
  char buf [20];
  char acStack_18 [20];
  char local_4 [4];
  
  if (-1 < *(int *)&(state->parse_state).field_0xc) {
    return (bool)in_AL;
  }
  pcVar2 = acStack_18 + 0x13;
  length = 0;
  do {
    *pcVar2 = (char)val + (char)(val / 10) * -10 + '0';
    length = length + 1;
    if (pcVar2 <= acStack_18) break;
    uVar1 = val - 10;
    pcVar2 = pcVar2 + -1;
    val = val / 10;
  } while (uVar1 < 0xffffffed);
  Append(state,local_4 + -length,length);
  return (bool)extraout_AL;
}

Assistant:

static bool MaybeAppendDecimal(State *state, int val) {
  // Max {32-64}-bit unsigned int is 20 digits.
  constexpr size_t kMaxLength = 20;
  char buf[kMaxLength];

  // We can't use itoa or sprintf as neither is specified to be
  // async-signal-safe.
  if (state->parse_state.append) {
    // We can't have a one-before-the-beginning pointer, so instead start with
    // one-past-the-end and manipulate one character before the pointer.
    char *p = &buf[kMaxLength];
    do {  // val=0 is the only input that should write a leading zero digit.
      *--p = static_cast<char>((val % 10) + '0');
      val /= 10;
    } while (p > buf && val != 0);

    // 'p' landed on the last character we set.  How convenient.
    Append(state, p, kMaxLength - static_cast<size_t>(p - buf));
  }

  return true;
}